

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  string_t new_value;
  
  if ((source->super_ArgMinMaxStateBase).is_initialized == true) {
    if ((target->super_ArgMinMaxStateBase).is_initialized == false) {
      uVar3 = (source->value).lower;
      lVar4 = (source->value).upper;
    }
    else {
      uVar3 = (source->value).lower;
      lVar4 = (source->value).upper;
      lVar2 = (target->value).upper;
      if ((lVar4 <= lVar2) && (uVar3 <= (target->value).lower || lVar4 != lVar2)) {
        return;
      }
    }
    (target->value).lower = uVar3;
    (target->value).upper = lVar4;
    bVar1 = (source->super_ArgMinMaxStateBase).arg_null;
    (target->super_ArgMinMaxStateBase).arg_null = bVar1;
    if (bVar1 == false) {
      new_value.value.pointer.ptr = (char *)lVar4;
      new_value.value._0_8_ = (source->arg).value.pointer.ptr;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&target->arg,*(string_t **)&(source->arg).value,new_value);
    }
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}